

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2RenderUtil.cpp
# Opt level: O1

void deqp::egl::gles2::readPixels(Functions *gl,Surface *dst,int x,int y,int width,int height)

{
  glReadPixelsFunc p_Var1;
  void *data;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  
  tcu::Surface::setSize(dst,width,height);
  p_Var1 = gl->readPixels;
  local_60.order = RGBA;
  local_60.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_58,&local_60,dst->m_width,dst->m_height,1,data);
  (*p_Var1)(x,y,width,height,0x1908,0x1401,local_58.super_ConstPixelBufferAccess.m_data);
  return;
}

Assistant:

void readPixels (const glw::Functions& gl, tcu::Surface& dst, int x, int y, int width, int height)
{
	dst.setSize(width, height);
	gl.readPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst.getAccess().getDataPtr());
}